

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_NtkFindSupp(Acb_Ntk_t *p,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *vSupp_00;
  Vec_Int_t *vSupp;
  int iObj;
  int i;
  Vec_Int_t *vRoots_local;
  Acb_Ntk_t *p_local;
  
  vSupp_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (vSupp._4_4_ = 0; iVar1 = Vec_IntSize(vRoots), vSupp._4_4_ < iVar1;
      vSupp._4_4_ = vSupp._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vRoots,vSupp._4_4_);
    iVar1 = Acb_NtkCo(p,iVar1);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    Acb_NtkFindSupp_rec(p,iVar1,vSupp_00);
  }
  Vec_IntSort(vSupp_00,0);
  return vSupp_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindSupp( Acb_Ntk_t * p, Vec_Int_t * vRoots )
{
    int i, iObj;
    Vec_Int_t * vSupp  = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Acb_NtkFindSupp_rec( p, iObj, vSupp );
    Vec_IntSort( vSupp, 0 );
    //Vec_IntPrint( vSupp );
    return vSupp;
}